

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::FileReadStream>
          (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,FileReadStream *is)

{
  bool bVar1;
  BooleanType BVar2;
  size_t sVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  ParseResult PVar4;
  CrtAllocator *local_98;
  undefined4 uStack_84;
  ClearStackOnExit local_68;
  ClearStackOnExit scope;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> reader;
  FileReadStream *is_local;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  bVar1 = internal::Stack<rapidjson::CrtAllocator>::HasAllocator
                    ((Stack<rapidjson::CrtAllocator> *)(this + 0x20));
  if (bVar1) {
    local_98 = internal::Stack<rapidjson::CrtAllocator>::GetAllocator
                         ((Stack<rapidjson::CrtAllocator> *)(this + 0x20));
  }
  else {
    local_98 = (CrtAllocator *)0x0;
  }
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericReader((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                 *)&scope,local_98,0x100);
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::ClearStackOnExit::ClearStackOnExit
            (&local_68,
             (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              *)this);
  PVar4 = GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<0u,rapidjson::FileReadStream,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&scope,is,
                     (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this);
  *(ulong *)(this + 0x50) = CONCAT44(uStack_84,PVar4.code_);
  *(size_t *)(this + 0x58) = PVar4.offset_;
  BVar2 = ParseResult::operator_cast_to_function_pointer((ParseResult *)(this + 0x50));
  if (BVar2 != 0) {
    sVar3 = internal::Stack<rapidjson::CrtAllocator>::GetSize
                      ((Stack<rapidjson::CrtAllocator> *)(this + 0x20));
    if (sVar3 != 0x10) {
      __assert_fail("stack_.GetSize() == sizeof(ValueType)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/document.h"
                    ,0x8d9,
                    "GenericDocument<Encoding, Allocator, StackAllocator> &rapidjson::GenericDocument<rapidjson::UTF8<>>::ParseStream(InputStream &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SourceEncoding = rapidjson::UTF8<>, InputStream = rapidjson::FileReadStream]"
                   );
    }
    rhs = internal::Stack<rapidjson::CrtAllocator>::
          Pop<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    ((Stack<rapidjson::CrtAllocator> *)(this + 0x20),1);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    operator=((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,rhs);
  }
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::ClearStackOnExit::~ClearStackOnExit(&local_68);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ~GenericReader((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  *)&scope);
  return (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *)this;
}

Assistant:

GenericDocument& ParseStream(InputStream& is) {
        GenericReader<SourceEncoding, Encoding, StackAllocator> reader(
            stack_.HasAllocator() ? &stack_.GetAllocator() : 0);
        ClearStackOnExit scope(*this);
        parseResult_ = reader.template Parse<parseFlags>(is, *this);
        if (parseResult_) {
            RAPIDJSON_ASSERT(stack_.GetSize() == sizeof(ValueType)); // Got one and only one root object
            ValueType::operator=(*stack_.template Pop<ValueType>(1));// Move value from stack to document
        }
        return *this;
    }